

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

x86Reg __thiscall CodeGenGenericContext::GetReg(CodeGenGenericContext *this)

{
  x86Reg xVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = this->currFreeReg;
  do {
    xVar1 = GetReg::regs[uVar2];
    bVar3 = uVar2 == 7;
    uVar2 = uVar2 + 1;
    if (bVar3) {
      uVar2 = 0;
    }
  } while ((xVar1 == this->lockedRegA) || (xVar1 == this->lockedRegB));
  this->currFreeReg = uVar2;
  return xVar1;
}

Assistant:

x86Reg CodeGenGenericContext::GetReg()
{
#if defined(_M_X64)
	static x86Reg regs[] = { rRAX, rRDX, rEDI, rESI, rR8, rR9, rR10, rR11, rR12 };

	// Simple rotation
	x86Reg res = regs[currFreeReg];

	if(res == rR11)
		currFreeReg = 0;
	else
		currFreeReg += 1;
#else
	static x86Reg regs[] = { rEAX, rEDX, rEDI, rECX };

	// Simple rotation
	x86Reg res = regs[currFreeReg];

	if(res == rECX)
		currFreeReg = 0;
	else
		currFreeReg += 1;
#endif

	if(res == lockedRegA || res == lockedRegB)
		return GetReg();

	return res;
}